

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VListNameToNum(VList *pIn,char *zName,int nName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (pIn != (VList *)0x0) {
    iVar1 = pIn[1];
    iVar3 = 2;
    do {
      iVar2 = strncmp((char *)(pIn + (long)iVar3 + 2),zName,(long)nName);
      if ((iVar2 == 0) && (*(char *)((long)(pIn + (long)iVar3 + 2) + (long)nName) == '\0')) {
        return pIn[iVar3];
      }
      iVar3 = iVar3 + (pIn + iVar3)[1];
    } while (iVar3 < iVar1);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VListNameToNum(VList *pIn, const char *zName, int nName){
  int i, mx;
  if( pIn==0 ) return 0;
  mx = pIn[1];
  i = 2;
  do{
    const char *z = (const char*)&pIn[i+2];
    if( strncmp(z,zName,nName)==0 && z[nName]==0 ) return pIn[i];
    i += pIn[i+1];
  }while( i<mx );
  return 0;
}